

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,void *ptr)

{
  int iVar1;
  uint uVar2;
  QTextStreamPrivate *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t
            .super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
            super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QTextStream: No device");
  }
  else {
    iVar1 = (this_00->params).integerBase;
    uVar2 = (this_00->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
            super_QFlagsStorage<QTextStream::NumberFlag>.i;
    (this_00->params).integerBase = 0x10;
    (this_00->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
    super_QFlagsStorage<QTextStream::NumberFlag>.i = uVar2 | 1;
    QTextStreamPrivate::putNumber(this_00,(qulonglong)ptr,false);
    (this_00->params).integerBase = iVar1;
    (this_00->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
    super_QFlagsStorage<QTextStream::NumberFlag>.i = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(const void *ptr)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    const int oldBase = d->params.integerBase;
    const NumberFlags oldFlags = d->params.numberFlags;
    d->params.integerBase = 16;
    d->params.numberFlags |= ShowBase;
    d->putNumber(reinterpret_cast<quintptr>(ptr), false);
    d->params.integerBase = oldBase;
    d->params.numberFlags = oldFlags;
    return *this;
}